

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall CFFFileInput::ReadEncodings(CFFFileInput *this)

{
  _Rb_tree_header *p_Var1;
  EStatusCode EVar2;
  iterator iVar3;
  _Rb_tree_header *p_Var4;
  long lVar5;
  unsigned_long i;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_>,_bool> pVar7;
  LongFilePositionType encodingPosition;
  EncodingsInfo *encoding;
  EncodingsInfoVector *local_78;
  pair<const_long_long,_EncodingsInfo_*> local_70;
  LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
  
  p_Var1 = &offsetToEncoding._M_t._M_impl.super__Rb_tree_header;
  offsetToEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsetToEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  offsetToEncoding._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = &this->mEncodings;
  lVar5 = 0x38;
  uVar6 = 0;
  offsetToEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  offsetToEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; uVar6 < this->mFontsCount; uVar6 = uVar6 + 1) {
    encodingPosition = GetEncodingPosition(this,(unsigned_short)uVar6);
    iVar3 = std::
            _Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
            ::find((_Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
                    *)&offsetToEncoding,&encodingPosition);
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
      encoding = (EncodingsInfo *)operator_new(0x50);
      p_Var4 = &(encoding->mSupplements)._M_t._M_impl.super__Rb_tree_header;
      (encoding->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (encoding->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (encoding->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var4->_M_header;
      (encoding->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var4->_M_header;
      (encoding->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      encoding->mEncoding = (Byte *)0x0;
      ReadEncoding(this,encoding,encodingPosition);
      std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::push_back(local_78,&encoding);
      local_70.first = encodingPosition;
      local_70.second = encoding;
      pVar7 = std::
              _Rb_tree<long_long,std::pair<long_long_const,EncodingsInfo*>,std::_Select1st<std::pair<long_long_const,EncodingsInfo*>>,std::less<long_long>,std::allocator<std::pair<long_long_const,EncodingsInfo*>>>
              ::_M_insert_unique<std::pair<long_long_const,EncodingsInfo*>>
                        ((_Rb_tree<long_long,std::pair<long_long_const,EncodingsInfo*>,std::_Select1st<std::pair<long_long_const,EncodingsInfo*>>,std::less<long_long>,std::allocator<std::pair<long_long_const,EncodingsInfo*>>>
                          *)&offsetToEncoding,&local_70);
      iVar3._M_node = (_Base_ptr)pVar7.first._M_node;
    }
    *(_Base_ptr *)(&(this->mTopDictIndex->mTopDict)._M_t._M_impl.field_0x0 + lVar5) =
         iVar3._M_node[1]._M_parent;
    lVar5 = lVar5 + 0x50;
  }
  EVar2 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  ::~_Rb_tree(&offsetToEncoding._M_t);
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadEncodings()
{
	// read all encodings positions
	EStatusCode status = PDFHummus::eSuccess;
	LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
	LongFilePositionTypeToEncodingsInfoMap::iterator it;

	for(unsigned long i=0; i < mFontsCount && (PDFHummus::eSuccess == status); ++i)
	{
		LongFilePositionType encodingPosition = GetEncodingPosition(i);
		it = offsetToEncoding.find(encodingPosition);
		if(it == offsetToEncoding.end())
		{
			EncodingsInfo* encoding = new EncodingsInfo();
			ReadEncoding(encoding,encodingPosition);
			mEncodings.push_back(encoding);
			it = offsetToEncoding.insert(LongFilePositionTypeToEncodingsInfoMap::value_type(encodingPosition,encoding)).first;
		}
		mTopDictIndex[i].mEncoding = it->second;
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();

}